

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O2

void render_open_td_block(MD_HTML *r,MD_CHAR *cell_type,MD_BLOCK_TD_DETAIL *det)

{
  MD_ALIGN MVar1;
  size_t sVar2;
  char *pcVar3;
  MD_SIZE MStack_20;
  
  (*r->process_output)("<",1,r->userdata);
  sVar2 = strlen(cell_type);
  (*r->process_output)(cell_type,(MD_SIZE)sVar2,r->userdata);
  MVar1 = det->align;
  if (MVar1 == MD_ALIGN_RIGHT) {
    pcVar3 = " align=\"right\">";
    MStack_20 = 0xf;
  }
  else if (MVar1 == MD_ALIGN_CENTER) {
    pcVar3 = " align=\"center\">";
    MStack_20 = 0x10;
  }
  else if (MVar1 == MD_ALIGN_LEFT) {
    pcVar3 = " align=\"left\">";
    MStack_20 = 0xe;
  }
  else {
    pcVar3 = ">";
    MStack_20 = 1;
  }
  (*r->process_output)(pcVar3,MStack_20,r->userdata);
  return;
}

Assistant:

static void
render_open_td_block(MD_HTML* r, const MD_CHAR* cell_type, const MD_BLOCK_TD_DETAIL* det)
{
    RENDER_VERBATIM(r, "<");
    RENDER_VERBATIM(r, cell_type);

    switch(det->align) {
        case MD_ALIGN_LEFT:     RENDER_VERBATIM(r, " align=\"left\">"); break;
        case MD_ALIGN_CENTER:   RENDER_VERBATIM(r, " align=\"center\">"); break;
        case MD_ALIGN_RIGHT:    RENDER_VERBATIM(r, " align=\"right\">"); break;
        default:                RENDER_VERBATIM(r, ">"); break;
    }
}